

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O3

void deqp::gls::ShaderExecUtil::checkLimit(RenderContext *renderCtx,deUint32 pname,int required)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar2;
  size_type *psVar3;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  undefined1 auVar4 [16];
  int implementationLimit;
  int local_140 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  string local_58;
  code *local_38;
  deUint32 local_30;
  
  local_140[1] = 2;
  iVar1 = (*renderCtx->_vptr_RenderContext[3])
                    (renderCtx,CONCAT44(in_register_00000034,pname),
                     CONCAT44(in_register_00000014,required));
  local_140[0] = -1;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(pname);
  local_78._M_string_length._0_4_ = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if ((int)local_78._M_string_length != 0) {
    auVar4 = __cxa_allocate_exception(0x38);
    local_98._M_dataplus._M_p = (pointer)glu::getGettableStateName;
    local_98._M_string_length._0_4_ = pname;
    de::toString<tcu::Format::Enum<int,2ul>>(&local_118,(de *)&local_98,auVar4._8_8_);
    std::operator+(&local_d8,"Failed to query ",&local_118);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_d8);
    local_138._M_dataplus._M_p = (pointer)*plVar2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_138._M_dataplus._M_p == psVar3) {
      local_138.field_2._M_allocated_capacity = *psVar3;
      local_138.field_2._8_8_ = plVar2[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar3;
    }
    local_138._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    local_78._M_dataplus._M_p = (pointer)glu::getErrorName;
    de::toString<tcu::Format::Enum<int,2ul>>
              (&local_f8,(de *)&local_78,(Enum<int,_2UL> *)local_138._M_string_length);
    std::operator+(&local_b8,&local_138,&local_f8);
    tcu::TestError::TestError(auVar4._0_8_,&local_b8);
    __cxa_throw(auVar4._0_8_,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (1 < local_140[0]) {
    return;
  }
  auVar4 = __cxa_allocate_exception(0x38);
  local_38 = glu::getGettableStateName;
  local_30 = pname;
  de::toString<tcu::Format::Enum<int,2ul>>(&local_98,(de *)&local_38,auVar4._8_8_);
  std::operator+(&local_f8,"Test requires ",&local_98);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_118._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_118._M_dataplus._M_p == psVar3) {
    local_118.field_2._M_allocated_capacity = *psVar3;
    local_118.field_2._8_8_ = plVar2[3];
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  }
  else {
    local_118.field_2._M_allocated_capacity = *psVar3;
  }
  local_118._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  de::toString<int>(&local_78,local_140 + 1);
  std::operator+(&local_d8,&local_118,&local_78);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_138._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_138._M_dataplus._M_p == psVar3) {
    local_138.field_2._M_allocated_capacity = *psVar3;
    local_138.field_2._8_8_ = plVar2[3];
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar3;
  }
  local_138._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  de::toString<int>(&local_58,local_140);
  std::operator+(&local_b8,&local_138,&local_58);
  tcu::NotSupportedError::NotSupportedError(auVar4._0_8_,&local_b8);
  __cxa_throw(auVar4._0_8_,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static void checkLimit (const glu::RenderContext& renderCtx, deUint32 pname, int required)
{
	const glw::Functions&	gl					= renderCtx.getFunctions();
	int						implementationLimit	= -1;
	deUint32				error;

	gl.getIntegerv(pname, &implementationLimit);
	error = gl.getError();

	if (error != GL_NO_ERROR)
		throw tcu::TestError("Failed to query " + de::toString(glu::getGettableStateStr(pname)) + " - got " + de::toString(glu::getErrorStr(error)));
	if (implementationLimit < required)
		throw tcu::NotSupportedError("Test requires " + de::toString(glu::getGettableStateStr(pname)) + " >= " + de::toString(required) + ", got " + de::toString(implementationLimit));
}